

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::AlignTextToFramePadding(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  float fVar6;
  
  pIVar4 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar3 = pIVar4->CurrentWindow;
  if (pIVar3->SkipItems == false) {
    fVar1 = (pIVar4->Style).FramePadding.y;
    fVar6 = fVar1 + fVar1 + pIVar4->FontSize;
    fVar1 = (pIVar3->DC).CurrLineSize.y;
    fVar2 = (pIVar3->DC).CurrLineTextBaseOffset;
    uVar5 = -(uint)(fVar6 <= fVar1);
    (pIVar3->DC).CurrLineSize.y = (float)(uVar5 & (uint)fVar1 | ~uVar5 & (uint)fVar6);
    fVar1 = (pIVar4->Style).FramePadding.y;
    uVar5 = -(uint)(fVar1 <= fVar2);
    (pIVar3->DC).CurrLineTextBaseOffset = (float)(~uVar5 & (uint)fVar1 | (uint)fVar2 & uVar5);
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }